

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  short *in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  short *in_stack_00000008;
  int rs;
  int s;
  int r;
  int c;
  uint zig;
  int t;
  int k;
  int dc;
  int diff;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  int local_40;
  int local_4;
  
  if (*(int *)(in_RDI + 0x4824) < 0x10) {
    stbi__grow_buffer_unsafe
              ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  iVar3 = stbi__jpeg_huff_decode
                    ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (stbi__huffman *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  if (iVar3 < 0) {
    local_4 = stbi__err("Corrupt JPEG");
  }
  else {
    memset(in_RSI,0,0x80);
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = stbi__extend_receive
                        ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                         ,in_stack_ffffffffffffff9c);
    }
    iVar4 = *(int *)(in_RDI + (long)in_R9D * 0x60 + 0x46b8) + iVar3;
    *(int *)(in_RDI + (long)in_R9D * 0x60 + 0x46b8) = iVar4;
    *in_RSI = (short)iVar4 * *in_stack_00000008;
    local_40 = 1;
    do {
      if (*(int *)(in_RDI + 0x4824) < 0x10) {
        stbi__grow_buffer_unsafe((stbi__jpeg *)CONCAT44(iVar3,in_stack_ffffffffffffffa0));
      }
      sVar2 = *(short *)(in_R8 + (long)(int)(*(uint *)(in_RDI + 0x4820) >> 0x17) * 2);
      uVar5 = (uint)sVar2;
      if (uVar5 == 0) {
        in_stack_ffffffffffffffa8 =
             stbi__jpeg_huff_decode
                       ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (stbi__huffman *)CONCAT44(iVar3,in_stack_ffffffffffffffa0));
        if ((int)in_stack_ffffffffffffffa8 < 0) {
          iVar3 = stbi__err("Corrupt JPEG");
          return iVar3;
        }
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffa8 & 0xf;
        if (in_stack_ffffffffffffffac == 0) {
          if (in_stack_ffffffffffffffa8 != 0xf0) break;
          local_40 = local_40 + 0x10;
        }
        else {
          iVar4 = ((int)in_stack_ffffffffffffffa8 >> 4) + local_40;
          local_40 = iVar4 + 1;
          bVar1 = stbi__jpeg_dezigzag[iVar4];
          iVar4 = stbi__extend_receive
                            ((stbi__jpeg *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff9c);
          in_RSI[(uint)bVar1] = (short)iVar4 * in_stack_00000008[(uint)bVar1];
        }
      }
      else {
        iVar4 = ((int)uVar5 >> 4 & 0xfU) + local_40;
        in_stack_ffffffffffffffac = uVar5 & 0xf;
        *(int *)(in_RDI + 0x4820) = *(int *)(in_RDI + 0x4820) << (sbyte)in_stack_ffffffffffffffac;
        *(uint *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) - in_stack_ffffffffffffffac;
        local_40 = iVar4 + 1;
        in_RSI[(uint)stbi__jpeg_dezigzag[iVar4]] =
             (short)(char)((ushort)sVar2 >> 8) * in_stack_00000008[(uint)stbi__jpeg_dezigzag[iVar4]]
        ;
      }
    } while (local_40 < 0x40);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}